

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

llama_sampler * llama_sampler_init_infill(llama_vocab *vocab)

{
  value_type *__val;
  undefined8 *puVar1;
  void *pvVar2;
  llama_sampler *plVar3;
  
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = vocab;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  pvVar2 = operator_new(0x200);
  puVar1[1] = pvVar2;
  puVar1[3] = (long)pvVar2 + 0x200;
  memset(pvVar2,0,0x200);
  puVar1[2] = (long)pvVar2 + 0x200;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  pvVar2 = operator_new(0x200);
  puVar1[4] = pvVar2;
  puVar1[6] = (long)pvVar2 + 0x200;
  memset(pvVar2,0,0x200);
  puVar1[5] = (long)pvVar2 + 0x200;
  plVar3 = (llama_sampler *)operator_new(0x10);
  plVar3->iface = &llama_sampler_infill_i;
  plVar3->ctx = puVar1;
  return plVar3;
}

Assistant:

struct llama_sampler * llama_sampler_init_infill(const struct llama_vocab * vocab) {
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_infill_i,
        /* .ctx   = */ new llama_sampler_infill {
            /* .vocab = */ vocab,
            /* .buf0  = */ std::vector<char>(512),
            /* .buf1  = */ std::vector<char>(512),
        }
    );
}